

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Document::~Document(Document *this)

{
  LazyObject *this_00;
  Connection *this_01;
  bool bVar1;
  reference ppVar2;
  reference ppVar3;
  value_type *v_1;
  iterator __end2_1;
  iterator __begin2_1;
  ConnectionMap *__range2_1;
  value_type *v;
  iterator __end2;
  iterator __begin2;
  ObjectMap *__range2;
  Document *this_local;
  
  __end2 = std::
           map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
           ::begin(&this->objects);
  v = (value_type *)
      std::
      map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
      ::end(&this->objects);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&v);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>::
             operator*(&__end2);
    this_00 = ppVar2->second;
    if (this_00 != (LazyObject *)0x0) {
      LazyObject::~LazyObject(this_00);
      operator_delete(this_00);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>::operator++
              (&__end2);
  }
  __end2_1 = std::
             multimap<unsigned_long,_const_Assimp::FBX::Connection_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
             ::begin(&this->src_connections);
  v_1 = (value_type *)
        std::
        multimap<unsigned_long,_const_Assimp::FBX::Connection_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
        ::end(&this->src_connections);
  while( true ) {
    bVar1 = std::operator!=(&__end2_1,(_Self *)&v_1);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>::
             operator*(&__end2_1);
    this_01 = ppVar3->second;
    if (this_01 != (Connection *)0x0) {
      Connection::~Connection(this_01);
      operator_delete(this_01);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>::
    operator++(&__end2_1);
  }
  std::
  unique_ptr<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
  ::~unique_ptr(&this->globals);
  std::
  vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  ::~vector(&this->animationStacksResolved);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->animationStacks);
  std::__cxx11::string::~string((string *)&this->creator);
  std::
  multimap<unsigned_long,_const_Assimp::FBX::Connection_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  ::~multimap(&this->dest_connections);
  std::
  multimap<unsigned_long,_const_Assimp::FBX::Connection_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  ::~multimap(&this->src_connections);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
  ::~map(&this->templates);
  std::
  map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
  ::~map(&this->objects);
  return;
}

Assistant:

Document::~Document()
{
    for(ObjectMap::value_type& v : objects) {
        delete v.second;
    }

    for(ConnectionMap::value_type& v : src_connections) {
        delete v.second;
    }
    // |dest_connections| contain the same Connection objects as the |src_connections|
}